

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

bool LoadScriptFile(int lumpnum,FileReader *lump,int numnodes,bool include,int type)

{
  FStrifeDialogueItemCheck *pFVar1;
  Node *pNVar2;
  uint uVar3;
  FTextureID FVar4;
  int iVar5;
  FStrifeDialogueNode *pFVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  char *pcVar10;
  PClassActor *pPVar11;
  PClassInventory *pPVar12;
  int iVar13;
  Response *responses;
  FName *buffer_00;
  long lVar14;
  char buffer [4];
  uint local_644;
  char local_640;
  char local_63f;
  char local_63e;
  char local_63d;
  int local_63c;
  FName local_638 [7];
  uint local_61c;
  uint local_618;
  uint local_614;
  char local_610 [8];
  int local_608;
  char local_604 [4];
  char local_600 [12];
  undefined1 local_5f4 [8];
  char local_5ec [8];
  char local_5e4 [292];
  undefined1 local_4c0 [1168];
  
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_640,4);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0xfffffffffffffffc,1);
  if (((local_640 == '\0') || (local_63f == '\0')) || (local_63e == '\0')) {
    if (type == 2) goto LAB_003e8072;
  }
  else {
    if (type == 2 && local_63d == '\0' || type == 1 && local_63d != '\0') goto LAB_003e8072;
    if (local_63d != '\0') {
      P_ParseUSDF(lumpnum,lump,numnodes);
      return true;
    }
  }
  if (!include) {
    LoadScriptFile("SCRIPT00",true,1);
  }
  if (((byte)gameinfo.flags & 2) == 0) {
    if (0x2b3ac2 < (numnodes * 0x12e9b5b3 + 0x567584U >> 2 | numnodes * -0x40000000)) {
LAB_003e8072:
      pcVar10 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
      DPrintf(1,"Incorrect data format for conversation script in %s.\n",pcVar10);
      return false;
    }
    local_63c = 0x5ec;
  }
  else {
    if (0x2c0b02 < (numnodes * 0x3f4fd3f5 + 0x1605810U >> 4 | numnodes * 0x50000000))
    goto LAB_003e8072;
    local_63c = 0x5d0;
  }
  local_63c = numnodes / local_63c;
  if (local_63c < 1) {
    return true;
  }
  iVar13 = 0;
  local_644 = 0;
  do {
    if (((byte)gameinfo.flags & 2) == 0) {
      pFVar6 = (FStrifeDialogueNode *)operator_new(0x50);
      (pFVar6->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
      (pFVar6->ItemCheck).Most = 0;
      (pFVar6->ItemCheck).Count = 0;
      (pFVar6->SpeakerVoice).ID = 0;
      pFVar6->Goodbye = (char *)0x0;
      (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_61c,0x5ec);
      pNVar2 = StrifeTypes.Nodes + (StrifeTypes.Size - 1 & local_61c);
      do {
        pNVar7 = pNVar2;
        if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
          pPVar11 = (PClassActor *)0x0;
          goto LAB_003e81d2;
        }
        pNVar2 = pNVar7->Next;
      } while ((pNVar7->Pair).Key != local_61c);
      pPVar11 = (pNVar7->Pair).Value;
LAB_003e81d2:
      pFVar6->SpeakerType = pPVar11;
      uVar3 = StrifeDialogues.Count;
      if ((-1 < (int)local_61c) && (local_644 != local_61c)) {
        if (pPVar11 != (PClassActor *)0x0) {
          local_638[0].Index =
               (pPVar11->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
               Index;
          pNVar8 = TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::GetNode
                             (&ClassRoots,local_638);
          (pNVar8->Pair).Value = uVar3;
        }
        uVar3 = StrifeDialogues.Count;
        pNVar9 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::GetNode
                           (&DialogueRoots,local_61c);
        (pNVar9->Pair).Value = uVar3;
        local_644 = local_61c;
      }
      pcVar10 = ncopystring(local_5e4);
      pFVar6->Dialogue = pcVar10;
      local_5e4[0] = '\0';
      FVar4 = FTextureManager::CheckForTexture(&TexMan,local_5ec,8,1);
      (pFVar6->Backdrop).texnum = FVar4.texnum;
      local_5ec[0] = '\0';
      mysnprintf((char *)local_638,0x10,"svox/%s",local_5f4);
      iVar5 = S_FindSound((char *)local_638);
      (pFVar6->SpeakerVoice).ID = iVar5;
      local_5f4[0] = 0;
      pcVar10 = ncopystring(local_604);
      pFVar6->SpeakerName = pcVar10;
      pNVar2 = StrifeTypes.Nodes + (StrifeTypes.Size - 1 & local_618);
      do {
        pNVar7 = pNVar2;
        if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
          pPVar11 = (PClassActor *)0x0;
          goto LAB_003e8397;
        }
        pNVar2 = pNVar7->Next;
      } while ((pNVar7->Pair).Key != local_618);
      pPVar11 = (pNVar7->Pair).Value;
LAB_003e8397:
      pPVar11 = dyn_cast<PClassActor>((DObject *)pPVar11);
      pFVar6->DropType = pPVar11;
      TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Grow(&pFVar6->ItemCheck,3);
      (pFVar6->ItemCheck).Count = 3;
      lVar14 = 0;
      do {
        pNVar2 = StrifeTypes.Nodes + (StrifeTypes.Size - 1 & *(uint *)(local_610 + lVar14 * 4 + -4))
        ;
        do {
          pNVar7 = pNVar2;
          if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
            pPVar11 = (PClassActor *)0x0;
            goto LAB_003e83f4;
          }
          pNVar2 = pNVar7->Next;
        } while ((pNVar7->Pair).Key != *(uint *)(local_610 + lVar14 * 4 + -4));
        pPVar11 = (pNVar7->Pair).Value;
LAB_003e83f4:
        pPVar12 = dyn_cast<PClassInventory>((DObject *)pPVar11);
        pFVar1 = (pFVar6->ItemCheck).Array;
        pFVar1[lVar14].Item = pPVar12;
        pFVar1[lVar14].Amount = -1;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      pFVar6->ItemCheckNode = local_608;
      pFVar6->Children = (FStrifeDialogueReply *)0x0;
      responses = (Response *)(local_4c0 + 0x1c);
    }
    else {
      pFVar6 = (FStrifeDialogueNode *)operator_new(0x50);
      (pFVar6->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
      (pFVar6->ItemCheck).Most = 0;
      (pFVar6->ItemCheck).Count = 0;
      (pFVar6->SpeakerVoice).ID = 0;
      pFVar6->Goodbye = (char *)0x0;
      (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_61c,0x5d0);
      pNVar2 = StrifeTypes.Nodes + (StrifeTypes.Size - 1 & local_61c);
      do {
        pNVar7 = pNVar2;
        if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
          pPVar11 = (PClassActor *)0x0;
          goto LAB_003e82f4;
        }
        pNVar2 = pNVar7->Next;
      } while ((pNVar7->Pair).Key != local_61c);
      pPVar11 = (pNVar7->Pair).Value;
LAB_003e82f4:
      pFVar6->SpeakerType = pPVar11;
      uVar3 = StrifeDialogues.Count;
      if ((-1 < (int)local_61c) && (local_644 != local_61c)) {
        if (pPVar11 != (PClassActor *)0x0) {
          local_638[0].Index =
               (pPVar11->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
               Index;
          pNVar8 = TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::GetNode
                             (&ClassRoots,local_638);
          (pNVar8->Pair).Value = uVar3;
        }
        uVar3 = StrifeDialogues.Count;
        pNVar9 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::GetNode
                           (&DialogueRoots,local_61c);
        (pNVar9->Pair).Value = uVar3;
        local_644 = local_61c;
      }
      pcVar10 = ncopystring(local_600);
      pFVar6->Dialogue = pcVar10;
      (pFVar6->Backdrop).texnum = -1;
      if (local_614 == 0) {
        buffer_00 = (FName *)0x0;
      }
      else {
        buffer_00 = local_638;
        mysnprintf((char *)buffer_00,0x10,"svox/voc%u");
      }
      iVar5 = S_FindSound((char *)buffer_00);
      (pFVar6->SpeakerVoice).ID = iVar5;
      local_600[0] = '\0';
      pcVar10 = ncopystring(local_610);
      pFVar6->SpeakerName = pcVar10;
      pNVar2 = StrifeTypes.Nodes + (StrifeTypes.Size - 1 & local_618);
      do {
        pNVar7 = pNVar2;
        if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
          pPVar11 = (PClassActor *)0x0;
          goto LAB_003e8496;
        }
        pNVar2 = pNVar7->Next;
      } while ((pNVar7->Pair).Key != local_618);
      pPVar11 = (pNVar7->Pair).Value;
LAB_003e8496:
      pPVar11 = dyn_cast<PClassActor>((DObject *)pPVar11);
      pFVar6->DropType = pPVar11;
      TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Grow(&pFVar6->ItemCheck,3);
      pFVar1 = (pFVar6->ItemCheck).Array;
      (pFVar6->ItemCheck).Count = 3;
      lVar14 = 8;
      do {
        *(undefined8 *)((long)pFVar1 + lVar14 + -8) = 0;
        *(undefined4 *)((long)&pFVar1->Item + lVar14) = 0xffffffff;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x38);
      pFVar6->ItemCheckNode = 0;
      pFVar6->Children = (FStrifeDialogueReply *)0x0;
      responses = (Response *)local_4c0;
    }
    ParseReplies(&pFVar6->Children,responses);
    TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Grow(&StrifeDialogues,1);
    StrifeDialogues.Array[StrifeDialogues.Count] = pFVar6;
    uVar3 = StrifeDialogues.Count + 1;
    pFVar6->ThisNodeNum = StrifeDialogues.Count;
    StrifeDialogues.Count = uVar3;
    iVar13 = iVar13 + 1;
    if (iVar13 == local_63c) {
      return true;
    }
  } while( true );
}

Assistant:

static bool LoadScriptFile(int lumpnum, FileReader *lump, int numnodes, bool include, int type)
{
	int i;
	DWORD prevSpeakerType;
	FStrifeDialogueNode *node;
	char buffer[4];

	lump->Read(buffer, 4);
	lump->Seek(-4, SEEK_CUR);

	// The binary format is so primitive that this check is enough to detect it.
	bool isbinary = (buffer[0] == 0 || buffer[1] == 0 || buffer[2] == 0 || buffer[3] == 0);

	if ((type == 1 && !isbinary) || (type == 2 && isbinary))
	{
		DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
		return false;
	}

	if (!isbinary)
	{
		P_ParseUSDF(lumpnum, lump, numnodes);
	}
	else 
	{
		if (!include)
		{
			LoadScriptFile("SCRIPT00", true, 1);
		}
		if (!(gameinfo.flags & GI_SHAREWARE))
		{
			// Strife scripts are always a multiple of 1516 bytes because each entry
			// is exactly 1516 bytes long.
			if (numnodes % 1516 != 0)
			{
				DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
				return false;
			}
			numnodes /= 1516;
		}
		else
		{
			// And the teaser version has 1488-byte entries.
			if (numnodes % 1488 != 0)
			{
				DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
				return false;
			}
			numnodes /= 1488;
		}

		prevSpeakerType = 0;

		for (i = 0; i < numnodes; ++i)
		{
			if (!(gameinfo.flags & GI_SHAREWARE))
			{
				node = ReadRetailNode (lump, prevSpeakerType);
			}
			else
			{
				node = ReadTeaserNode (lump, prevSpeakerType);
			}
			node->ThisNodeNum = StrifeDialogues.Push(node);
		}
	}
	return true;
}